

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  _GLFWjoystick *p_Var2;
  char *pcVar3;
  _GLFWjoystick *js;
  int local_130;
  int version;
  int fd;
  int jid;
  char name [256];
  char local_1a;
  char local_19;
  char buttonCount;
  char *pcStack_18;
  char axisCount;
  char *path_local;
  
  pcStack_18 = path;
  memset(&fd,0,0x100);
  version = 0;
  while( true ) {
    if (0xf < version) {
      local_130 = open(pcStack_18,0x800);
      if (local_130 == -1) {
        path_local._4_4_ = 0;
      }
      else {
        ioctl(local_130,0x80046a01,(long)&js + 4);
        if (js._4_4_ < 0x10000) {
          close(local_130);
          path_local._4_4_ = 0;
        }
        else {
          iVar1 = ioctl(local_130,0x81006a13,&fd);
          if (iVar1 < 0) {
            strncpy((char *)&fd,"Unknown",0x100);
          }
          ioctl(local_130,0x80016a11,&local_19);
          ioctl(local_130,0x80016a12,&local_1a);
          p_Var2 = _glfwAllocJoystick((char *)&fd,(int)local_19,(int)local_1a);
          if (p_Var2 == (_GLFWjoystick *)0x0) {
            close(local_130);
            path_local._4_4_ = 0;
          }
          else {
            pcVar3 = strdup(pcStack_18);
            (p_Var2->linjs).path = pcVar3;
            (p_Var2->linjs).fd = local_130;
            _glfwInputJoystick((int)((long)&p_Var2[-0x4df4].buttonCount >> 6),0x40001);
            path_local._4_4_ = 1;
          }
        }
      }
      return path_local._4_4_;
    }
    if ((_glfw.joysticks[version].present != 0) &&
       (iVar1 = strcmp(_glfw.joysticks[version].linjs.path,pcStack_18), iVar1 == 0)) break;
    version = version + 1;
  }
  return 0;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    char axisCount, buttonCount;
    char name[256] = "";
    int jid, fd, version;
    _GLFWjoystick* js;

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].present)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return GLFW_FALSE;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return GLFW_FALSE;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    ioctl(fd, JSIOCGAXES, &axisCount);
    ioctl(fd, JSIOCGBUTTONS, &buttonCount);

    js = _glfwAllocJoystick(name, axisCount, buttonCount);
    if (!js)
    {
        close(fd);
        return GLFW_FALSE;
    }

    js->linjs.path = strdup(path);
    js->linjs.fd = fd;

    _glfwInputJoystick(_GLFW_JOYSTICK_ID(js), GLFW_CONNECTED);
    return GLFW_TRUE;
}